

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

char * __thiscall cmState::Directory::GetProperty(Directory *this,string *prop,bool chain)

{
  Snapshot *this_00;
  long lVar1;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar2;
  bool bVar3;
  int iVar4;
  PointerType pBVar5;
  char *pcVar6;
  PointerType pSVar7;
  ulong uVar8;
  cmState *pcVar9;
  cmState *pcVar10;
  _Alloc_hider _Var11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  Snapshot local_88;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_40;
  cmState *local_38;
  
  if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
    GetProperty();
  }
  std::__cxx11::string::_M_replace
            (0x61b638,0,
             (char *)GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.
                     _M_string_length,0x54d34f);
  iVar4 = std::__cxx11::string::compare((char *)prop);
  if (iVar4 == 0) {
    Snapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
    bVar3 = Snapshot::IsValid(&local_88);
    if (!bVar3) {
      return "";
    }
    pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                       ((iterator *)((long)&local_88 + 8));
    local_70._0_8_ = (pSVar7->BuildSystemDirectory).Tree;
    local_70._8_8_ = (pSVar7->BuildSystemDirectory).Position;
    local_60._0_8_ = local_88.State;
    local_60._8_8_ = local_88.Position.Tree;
    local_60._16_8_ = local_88.Position.Position;
    pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                       ((iterator *)local_70);
    return (pBVar5->Location)._M_dataplus._M_p;
  }
  iVar4 = std::__cxx11::string::compare((char *)prop);
  if (iVar4 == 0) {
    local_88._0_16_ = ZEXT816(0);
    local_88.Position.Position = 0;
    local_38 = (cmState *)(this->Snapshot_).Position.Position;
    this_00 = (Snapshot *)(local_60 + 0x18);
    local_60._24_8_ = (this->Snapshot_).State;
    pcStack_40 = (this->Snapshot_).Position.Tree;
    while (bVar3 = Snapshot::IsValid(this_00), bVar3) {
      Snapshot::GetExecutionListFile_abi_cxx11_((string *)local_70,this_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (string *)local_70);
      if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      }
      Snapshot::GetCallStackParent((Snapshot *)local_70,this_00);
      local_38 = (cmState *)local_60._0_8_;
      local_60._24_8_ = local_70._0_8_;
      pcStack_40 = (cmLinkedTree<cmState::SnapshotDataType> *)local_70._8_8_;
    }
    pcVar10 = (cmState *)((long)local_88.Position.Tree + 0xfffffffffffffde0U + 0x200);
    pcVar9 = local_88.State;
    if (local_88.State < pcVar10 && local_88.State != (cmState *)local_88.Position.Tree) {
      do {
        std::__cxx11::string::swap((string *)pcVar9);
        pcVar9 = (cmState *)
                 &(pcVar9->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_right;
        pcVar10 = (cmState *)((long)pcVar10 + 0xffffffffffffffe0);
      } while (pcVar9 < pcVar10);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,";");
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
               (string *)local_70);
    _Var11 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
    if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      _Var11 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)prop);
    if (iVar4 == 0) {
      GetCacheEntryKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,(this->Snapshot_).State);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_70,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,";");
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_70);
      if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    iVar4 = std::__cxx11::string::compare((char *)prop);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)prop);
      if (iVar4 == 0) {
        local_88._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)prop);
        if (iVar4 == 0) {
          local_88._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)prop);
          if (iVar4 != 0) {
            pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                               (&this->DirectoryState);
            pcVar6 = cmPropertyMap::GetPropertyValue(&pBVar5->Properties,prop);
            if (!chain || pcVar6 != (char *)0x0) {
              return pcVar6;
            }
            Snapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
            bVar3 = Snapshot::IsValid(&local_88);
            if (bVar3) {
              pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                                 ((iterator *)((long)&local_88 + 8));
              local_70._0_8_ = (pSVar7->BuildSystemDirectory).Tree;
              local_70._8_8_ = (pSVar7->BuildSystemDirectory).Position;
              local_60._0_8_ = local_88.State;
              local_60._8_8_ = local_88.Position.Tree;
              local_60._16_8_ = local_88.Position.Position;
              pcVar6 = GetProperty((Directory *)local_70,prop,true);
              return pcVar6;
            }
            pcVar6 = GetGlobalProperty((this->Snapshot_).State,prop);
            return pcVar6;
          }
          local_88._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
        }
      }
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((string *)local_70,
                 (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_88,";");
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_70);
      if ((cmState *)local_70._0_8_ == (cmState *)local_60) {
        return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
      }
      operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    Snapshot::ClosureKeys_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,&this->Snapshot_);
    GetCacheEntryKeys_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_60 + 0x18),(this->Snapshot_).State);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               local_88.Position.Tree,local_60._24_8_,pcStack_40);
    pcVar10 = local_88.State;
    pcVar2 = local_88.Position.Tree;
    if (local_88.State != (cmState *)local_88.Position.Tree) {
      uVar8 = (long)local_88.Position.Tree - (long)local_88.State >> 5;
      lVar1 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_88.State,local_88.Position.Tree,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pcVar10,pcVar2);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,";");
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
               (string *)local_70);
    if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
    }
    _Var11._M_p = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_60 + 0x18));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  return _Var11._M_p;
}

Assistant:

const char*
cmState::Directory::GetProperty(const std::string& prop, bool chain) const
{
  static std::string output;
  output = "";
  if (prop == "PARENT_DIRECTORY")
    {
    cmState::Snapshot parent =
        this->Snapshot_.GetBuildsystemDirectoryParent();
    if(parent.IsValid())
      {
      return parent.GetDirectory().GetCurrentSource();
      }
    return "";
    }
  else if (prop == "LISTFILE_STACK")
    {
    std::vector<std::string> listFiles;
    cmState::Snapshot snp = this->Snapshot_;
    while (snp.IsValid())
      {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
      }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
    }
  else if ( prop == "CACHE_VARIABLES" )
    {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
    }
  else if (prop == "VARIABLES")
    {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    std::vector<std::string> cacheKeys =
        this->Snapshot_.State->GetCacheEntryKeys();
    res.insert(res.end(), cacheKeys.begin(), cacheKeys.end());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
    }
  else if (prop == "INCLUDE_DIRECTORIES")
    {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
    }
  else if (prop == "COMPILE_OPTIONS")
    {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
    }
  else if (prop == "COMPILE_DEFINITIONS")
    {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
    }

  const char *retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain)
    {
    Snapshot parentSnapshot = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid())
      {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
      }
    return this->Snapshot_.State->GetGlobalProperty(prop);
    }

  return retVal;
}